

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)1>_>::~ParticleTest_GetGamma_Test
          (ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  void *in_RDI;
  
  ~ParticleTest_GetGamma_Test
            ((ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)1>_> *)0x202ca8);
  operator_delete(in_RDI,0x20);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetGamma)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;

    ParticleType particle = this->randomParticle();
    GammaType expectedGamma = sqrt(static_cast<GammaType>(1.0) + particle.getMomentum().norm2() /
        sqr(particle.getMass() * Constants<GammaType>::c()));
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}